

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_map.cc
# Opt level: O1

int bloaty::sourcemap::ReadBase64VLQSegment(string_view *data,int32_t (*values) [5])

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  Nonnull<char_*> pcVar4;
  ulong uVar5;
  byte *pbVar6;
  uint unaff_EBP;
  uint uVar7;
  byte *pbVar8;
  byte *pbVar9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  byte *pbVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  string_view format;
  string_view format_00;
  string local_80;
  long local_60;
  byte *local_58;
  byte local_50 [32];
  Arg *a0;
  
  pbVar8 = (byte *)data->_M_len;
  pbVar9 = (byte *)data->_M_str;
  uVar5 = 0;
  bVar15 = false;
  do {
    pbVar1 = pbVar9 + (long)pbVar8;
    uVar10 = ~(ulong)pbVar9;
    bVar2 = 0;
    uVar12 = 0;
    pbVar13 = pbVar9;
    pbVar6 = pbVar9;
    do {
      pbVar6 = pbVar6 + 1;
      if (pbVar1 <= pbVar13) {
        Throw("Unterminated Base64VLQ",0x5a);
      }
      local_50[0] = *pbVar13;
      uVar7 = (uint)(char)local_50[0];
      a0 = (Arg *)(ulong)uVar7;
      bVar14 = (byte)(local_50[0] + 0xa5) < 0xe6;
      bVar11 = local_50[0] + 0x99;
      if (bVar11 < 0xfa && bVar14) {
        if ((0x13 < bVar11) && ((byte)(local_50[0] - 0x3a) < 0xf5 && local_50[0] != 0x2b)) {
          local_58 = local_50;
          local_60 = 1;
          format._M_str = (char *)&local_60;
          format._M_len = (size_t)"Invalid Base64VLQ digit $0";
          absl::Substitute_abi_cxx11_(&local_80,(absl *)0x1a,format,a0);
          Throw(local_80._M_dataplus._M_p,0x50);
        }
        if ((char)local_50[0] < ':') {
          if ('/' < (char)local_50[0]) {
            uVar7 = uVar7 - 0x1c;
            goto LAB_0019c56b;
          }
          uVar7 = local_50[0] == 0x2b ^ 0x1f;
        }
        else {
          uVar7 = uVar7 - 0x67;
LAB_0019c56b:
          a0 = (Arg *)(ulong)uVar7;
        }
        uVar12 = uVar7 << (bVar2 & 0x1f) | uVar12;
        bVar2 = bVar2 + 5;
      }
      else {
        iVar3 = uVar7 - 0x41;
        if ('`' < (char)local_50[0]) {
          iVar3 = uVar7 - 0x47;
        }
        uVar12 = iVar3 << (bVar2 & 0x1f) | uVar12;
        data->_M_str = (char *)pbVar6;
        pbVar8 = pbVar9 + (long)(pbVar8 + uVar10);
        data->_M_len = (size_t)pbVar8;
        pbVar9 = pbVar6;
        unaff_EBP = -(uVar12 >> 1);
        if ((uVar12 & 1) == 0) {
          unaff_EBP = uVar12 >> 1;
        }
      }
      pbVar13 = pbVar13 + 1;
      uVar10 = uVar10 - 1;
    } while (bVar11 < 0xfa && bVar14);
    (*values)[uVar5] = unaff_EBP;
    if (pbVar8 == (byte *)0x0) {
LAB_0019c5ea:
      if ((uVar5 & 3) != 0 && uVar5 != 3) {
        pcVar4 = absl::numbers_internal::FastIntToBuffer((int)uVar5 + 1,(Nonnull<char_*>)local_50);
        local_60 = (long)pcVar4 - (long)local_50;
        format_00._M_str = (char *)&local_60;
        format_00._M_len = (size_t)"Invalid source map VLQ segment length $0";
        local_58 = local_50;
        absl::Substitute_abi_cxx11_(&local_80,(absl *)0x28,format_00,a0);
        Throw(local_80._M_dataplus._M_p,0x67);
      }
      iVar3 = (int)uVar5 + 1;
      break;
    }
    bVar2 = *pbVar9;
    if ((0x19 < (byte)((bVar2 & 0xdf) + 0xbf)) &&
       (bVar16 = bVar2 == 0x2b, bVar14 = (byte)(bVar2 - 0x2f) < 0xb, bVar2 = bVar14 || bVar16,
       !bVar14 && !bVar16)) goto LAB_0019c5ea;
    iVar3 = (int)CONCAT71((int7)((ulong)values >> 8),bVar2);
    bVar15 = 3 < uVar5;
    uVar5 = uVar5 + 1;
  } while (uVar5 != 5);
  if (bVar15) {
    Throw("Unterminated Base64VLQ segment",0x6c);
  }
  return iVar3;
}

Assistant:

static int ReadBase64VLQSegment(std::string_view* data, int32_t (&values)[5]) {
  for (int i = 0; i < 5; i++) {
    values[i] = ReadBase64VLQ(data);
    if (data->empty() || !IsBase64Digit(data->front())) {
      if (i != 0 && i != 3 && i != 4) {
        THROWF("Invalid source map VLQ segment length $0", i + 1);
      }
      return i + 1;
    }
  }
  THROW("Unterminated Base64VLQ segment");
}